

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O3

void __thiscall reader_url_suite::test_fragment_plain::test_method(test_fragment_plain *this)

{
  bool bVar1;
  uint uVar2;
  value vVar3;
  uint local_340;
  value local_33c;
  view_type *local_338;
  uint *local_330;
  undefined **local_328;
  undefined1 local_320;
  undefined8 *local_318;
  uint **local_310;
  view_type local_308;
  undefined8 *local_2f8;
  value *local_2f0;
  undefined1 local_2e8 [8];
  undefined8 local_2e0;
  shared_count sStack_2d8;
  undefined **local_2d0;
  undefined1 local_2c8;
  undefined8 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  url reader;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char input [35];
  
  local_308.ptr_ = input;
  builtin_strncpy(input,"scheme://example.com/path#fragment",0x23);
  local_308.len_ = strlen(local_308.ptr_);
  trial::url::reader::basic_url<char>::basic_url(&reader,&local_308);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0xdd);
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_00186288;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = "";
  local_338 = (view_type *)&local_33c;
  local_33c = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_330 = &local_340;
  local_2e8[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token == scheme;
  local_340 = 2;
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a8 = "";
  local_2f0 = (value *)&local_338;
  local_308.len_ = local_308.len_ & 0xffffffffffffff00;
  local_308.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_320 = 0;
  local_310 = &local_330;
  local_328 = &PTR__lazy_ostream_00186618;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0xde);
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_00186288;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 6) {
    local_2e8[0] = *(short *)(reader.super_base<char,_trial::url::reader::basic_url>.current_view.
                              ptr_ + 4) == 0x656d &&
                   *(int *)reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_
                   == 0x65686373;
  }
  else {
    local_2e8[0] = false;
  }
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a8 = "";
  local_338 = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_308.len_ = local_308.len_ & 0xffffffffffffff00;
  local_308.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = (value *)&local_338;
  local_330 = (uint *)0x16fe43;
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186358;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (local_2e8,&local_2d0,&local_2b0,0xde,2,2,2,"reader.literal()",&local_308,"\"scheme\"",
             &local_328);
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a8,0xdf);
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_00186288;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = "";
  local_2e8[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_33c = CONCAT31(local_33c._1_3_,local_2e8[0]);
  local_340 = CONCAT31(local_340._1_3_,1);
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a8 = "";
  local_338 = (view_type *)&local_33c;
  local_308.len_ = local_308.len_ & 0xffffffffffffff00;
  local_308.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = (value *)&local_338;
  local_330 = &local_340;
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_001865d8;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (local_2e8,&local_2d0,&local_2b0,0xdf,2,2,2,"reader.next()",&local_308,"true",&local_328
            );
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c8,0xe0);
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_00186288;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = "";
  local_2e8[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 authority_host_name;
  local_33c = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_340 = 4;
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a8 = "";
  local_338 = (view_type *)&local_33c;
  local_308.len_ = local_308.len_ & 0xffffffffffffff00;
  local_308.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = (value *)&local_338;
  local_330 = &local_340;
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186618;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (local_2e8,&local_2d0,&local_2b0,0xe0,2,2,2,"reader.subcode()",&local_308,
             "url::token::subcode::authority_host_name",&local_328);
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0xe1);
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_00186288;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 0xb) {
    local_2e8[0] = *(long *)(reader.super_base<char,_trial::url::reader::basic_url>.current_view.
                             ptr_ + 3) == 0x6d6f632e656c706d &&
                   *(long *)reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_
                   == 0x2e656c706d617865;
  }
  else {
    local_2e8[0] = false;
  }
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a8 = "";
  local_338 = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_308.len_ = local_308.len_ & 0xffffffffffffff00;
  local_308.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_330 = (uint *)0x16f1f0;
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186458;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = &local_330;
  local_2f0 = (value *)&local_338;
  boost::test_tools::tt_detail::report_assertion
            (local_2e8,&local_2d0,&local_2b0,0xe1,2,2,2,"reader.literal()",&local_308,
             "\"example.com\"",&local_328);
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0xe2);
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_00186288;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = "";
  local_2e8[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_33c = CONCAT31(local_33c._1_3_,local_2e8[0]);
  local_340 = CONCAT31(local_340._1_3_,1);
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a8 = "";
  local_338 = (view_type *)&local_33c;
  local_308.len_ = local_308.len_ & 0xffffffffffffff00;
  local_308.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_330 = &local_340;
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_001865d8;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = &local_330;
  local_2f0 = (value *)&local_338;
  boost::test_tools::tt_detail::report_assertion
            (local_2e8,&local_2d0,&local_2b0,0xe2,2,2,2,"reader.next()",&local_308,"true",&local_328
            );
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0xe3);
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_00186288;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = "";
  local_2e8[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 path_segment;
  local_33c = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_340 = 8;
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a8 = "";
  local_338 = (view_type *)&local_33c;
  local_308.len_ = local_308.len_ & 0xffffffffffffff00;
  local_308.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_330 = &local_340;
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186618;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = &local_330;
  local_2f0 = (value *)&local_338;
  boost::test_tools::tt_detail::report_assertion
            (local_2e8,&local_2d0,&local_2b0,0xe3,2,2,2,"reader.subcode()",&local_308,
             "url::token::subcode::path_segment",&local_328);
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0xe4);
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_00186288;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 4) {
    local_2e8[0] = *(int *)reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_
                   == 0x68746170;
  }
  else {
    local_2e8[0] = false;
  }
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a8 = "";
  local_338 = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_308.len_ = local_308.len_ & 0xffffffffffffff00;
  local_308.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = (value *)&local_338;
  local_330 = (uint *)0x16ffef;
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186698;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (local_2e8,&local_2d0,&local_2b0,0xe4,2,2,2,"reader.literal()",&local_308,"\"path\"",
             &local_328);
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0xe5);
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_00186288;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = "";
  local_2e8[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_33c = CONCAT31(local_33c._1_3_,local_2e8[0]);
  local_340 = CONCAT31(local_340._1_3_,1);
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a8 = "";
  local_338 = (view_type *)&local_33c;
  vVar3 = end;
  local_308.len_ = local_308.len_ & 0xffffffffffffff00;
  local_308.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = (value *)&local_338;
  local_330 = &local_340;
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_001865d8;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (local_2e8,&local_2d0,&local_2b0,0xe5,2,2,2,"reader.next()",&local_308,"true",&local_328
            );
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0xe6);
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_00186288;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = "";
  uVar2 = reader.super_base<char,_trial::url::reader::basic_url>.current_token - scheme;
  local_2e8[0] = 0;
  if (uVar2 < 0xb) {
    local_2e8[0] = (&DAT_00170651)[uVar2];
    vVar3 = *(value *)(&DAT_00170a00 + (ulong)uVar2 * 4);
  }
  local_340 = 5;
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a8 = "";
  local_338 = (view_type *)&local_33c;
  local_308.len_ = local_308.len_ & 0xffffffffffffff00;
  local_308.ptr_ = (char *)&PTR__lazy_ostream_00186518;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = (value *)&local_338;
  local_330 = &local_340;
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186518;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_33c = vVar3;
  local_310 = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (local_2e8,&local_2d0,&local_2b0,0xe6,2,2,2,"reader.category()",&local_308,
             "url::token::category::fragment",&local_328);
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0xe7);
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_00186288;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = "";
  local_33c = trial::url::reader::base<char,_trial::url::reader::basic_url>::code
                        (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_340 = 8;
  local_2e8[0] = local_33c == fragment;
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a8 = "";
  local_308.len_ = local_308.len_ & 0xffffffffffffff00;
  local_308.ptr_ = (char *)&PTR__lazy_ostream_00186558;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = (value *)&local_338;
  local_330 = &local_340;
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186558;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_338 = (view_type *)&local_33c;
  local_310 = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (local_2e8,&local_2d0,&local_2b0,0xe7,2,2,2,"reader.code()",&local_308,
             "url::token::code::fragment",&local_328);
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0xe8);
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_00186288;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = "";
  local_2e8[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token == fragment;
  local_33c = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_340 = 0xc;
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a8 = "";
  local_308.len_ = local_308.len_ & 0xffffffffffffff00;
  local_308.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = (value *)&local_338;
  local_330 = &local_340;
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186618;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_338 = (view_type *)&local_33c;
  local_310 = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (local_2e8,&local_2d0,&local_2b0,0xe8,2,2,2,"reader.subcode()",&local_308,
             "url::token::subcode::fragment",&local_328);
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e8,0xe9);
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_00186288;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 8) {
    local_2e8[0] = *(long *)reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_
                   == 0x746e656d67617266;
  }
  else {
    local_2e8[0] = false;
  }
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a8 = "";
  local_338 = &reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_308.len_ = local_308.len_ & 0xffffffffffffff00;
  local_308.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = (value *)&local_338;
  local_330 = (uint *)0x173fdd;
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_001864d8;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (local_2e8,&local_2d0,&local_2b0,0xe9,2,2,2,"reader.literal()",&local_308,"\"fragment\""
             ,&local_328);
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_200 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0xea);
  local_2c8 = 0;
  local_2d0 = &PTR__lazy_ostream_00186288;
  local_2c0 = &boost::unit_test::lazy_ostream::inst;
  local_2b8 = "";
  bVar1 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_33c = CONCAT31(local_33c._1_3_,bVar1);
  local_340 = local_340 & 0xffffff00;
  local_2e8[0] = !bVar1;
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2a8 = "";
  local_338 = (view_type *)&local_33c;
  local_308.len_ = local_308.len_ & 0xffffffffffffff00;
  local_308.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_2f8 = &boost::unit_test::lazy_ostream::inst;
  local_2f0 = (value *)&local_338;
  local_330 = &local_340;
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_001865d8;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = &local_330;
  boost::test_tools::tt_detail::report_assertion
            (local_2e8,&local_2d0,&local_2b0,0xea,2,2,2,"reader.next()",&local_308,"false",
             &local_328);
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_fragment_plain)
{
    const char input[] = "scheme://example.com/path#fragment";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_name);
    BOOST_REQUIRE_EQUAL(reader.literal(), "example.com");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::fragment);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::fragment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::fragment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "fragment");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}